

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_pagecontrol.cpp
# Opt level: O2

void QtMWidgets::PageControl::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  int *piVar1;
  undefined8 uVar2;
  int iVar3;
  QColor *pQVar4;
  Spec SVar5;
  
  switch(_c) {
  case InvokeMetaMethod:
    if (_id == 2) {
      SVar5 = *_a[1];
LAB_001609ce:
      setCount((PageControl *)_o,SVar5);
      return;
    }
    if (_id == 1) {
      SVar5 = *_a[1];
LAB_001609b2:
      setCurrentIndex((PageControl *)_o,SVar5);
      return;
    }
    if (_id == 0) {
      currentChanged((PageControl *)_o,*_a[1],*_a[2]);
      return;
    }
    break;
  case ReadProperty:
    if (3 < (uint)_id) {
      return;
    }
    piVar1 = (int *)*_a;
    switch(_id) {
    case 0:
      iVar3 = currentIndex((PageControl *)_o);
      break;
    case 1:
      iVar3 = count((PageControl *)_o);
      break;
    case 2:
      pQVar4 = pageIndicatorColor((PageControl *)_o);
      goto LAB_001609e0;
    case 3:
      pQVar4 = currentPageIndicatorColor((PageControl *)_o);
LAB_001609e0:
      uVar2 = *(undefined8 *)((long)&pQVar4->ct + 2);
      *(undefined8 *)piVar1 = *(undefined8 *)pQVar4;
      *(undefined8 *)((long)piVar1 + 6) = uVar2;
      return;
    }
    *piVar1 = iVar3;
    break;
  case WriteProperty:
    if ((uint)_id < 4) {
      pQVar4 = (QColor *)*_a;
      switch(_id) {
      case 0:
        SVar5 = pQVar4->cspec;
        goto LAB_001609b2;
      case 1:
        SVar5 = pQVar4->cspec;
        break;
      case 2:
        setPageIndicatorColor((PageControl *)_o,pQVar4);
        return;
      case 3:
        setCurrentPageIndicatorColor((PageControl *)_o,pQVar4);
        return;
      }
      goto LAB_001609ce;
    }
    break;
  case IndexOfMethod:
    if ((*_a[1] == currentChanged) && (*(long *)((long)_a[1] + 8) == 0)) {
      *(undefined4 *)*_a = 0;
    }
  }
  return;
}

Assistant:

void QtMWidgets::PageControl::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    if (_c == QMetaObject::InvokeMetaMethod) {
        auto *_t = static_cast<PageControl *>(_o);
        (void)_t;
        switch (_id) {
        case 0: _t->currentChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2]))); break;
        case 1: _t->setCurrentIndex((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 2: _t->setCount((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        default: ;
        }
    } else if (_c == QMetaObject::IndexOfMethod) {
        int *result = reinterpret_cast<int *>(_a[0]);
        {
            using _t = void (PageControl::*)(int , int );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&PageControl::currentChanged)) {
                *result = 0;
                return;
            }
        }
    }
#ifndef QT_NO_PROPERTIES
    else if (_c == QMetaObject::ReadProperty) {
        auto *_t = static_cast<PageControl *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast< int*>(_v) = _t->currentIndex(); break;
        case 1: *reinterpret_cast< int*>(_v) = _t->count(); break;
        case 2: *reinterpret_cast< QColor*>(_v) = _t->pageIndicatorColor(); break;
        case 3: *reinterpret_cast< QColor*>(_v) = _t->currentPageIndicatorColor(); break;
        default: break;
        }
    } else if (_c == QMetaObject::WriteProperty) {
        auto *_t = static_cast<PageControl *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setCurrentIndex(*reinterpret_cast< int*>(_v)); break;
        case 1: _t->setCount(*reinterpret_cast< int*>(_v)); break;
        case 2: _t->setPageIndicatorColor(*reinterpret_cast< QColor*>(_v)); break;
        case 3: _t->setCurrentPageIndicatorColor(*reinterpret_cast< QColor*>(_v)); break;
        default: break;
        }
    } else if (_c == QMetaObject::ResetProperty) {
    } else if (_c == QMetaObject::BindableProperty) {
    }
#endif // QT_NO_PROPERTIES
}